

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

void __thiscall
Lib::CombinationIterator<unsigned_int>::CombinationIterator
          (CombinationIterator<unsigned_int> *this,uint from,uint to)

{
  uint in_EDX;
  uint in_ESI;
  CombinationIterator<unsigned_int> *in_RDI;
  
  in_RDI->_first = in_ESI;
  in_RDI->_second = in_ESI;
  in_RDI->_afterLast = in_EDX;
  if (in_ESI != in_EDX) {
    if (in_ESI + 1 == in_EDX) {
      in_RDI->_second = in_RDI->_afterLast;
    }
    else {
      moveToNext(in_RDI);
    }
  }
  return;
}

Assistant:

CombinationIterator(T from, T to)
  : _first(from), _second(from), _afterLast(to)
  {
    ASS_LE(from,to);
    if(from!=to) {
      if(from+1==to) {
	_second=_afterLast;
      } else {
	moveToNext();
      }
    }
  }